

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curleasy.cpp
# Opt level: O1

Easy * __thiscall curl::Easy::operator=(Easy *this,Easy *other)

{
  CURL *pCVar1;
  runtime_error *this_00;
  
  pCVar1 = (CURL *)curl_easy_duphandle(other->handle);
  if (pCVar1 != (CURL *)0x0) {
    curl_easy_cleanup(this->handle);
    this->handle = pCVar1;
    return this;
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error
            (this_00,"curl::Easy copy assignment: curl_easy_duphandle failed");
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

Easy& Easy::operator=(const Easy& other) {
    CURL* tmp_handle = curl_easy_duphandle(other.handle);
    if(tmp_handle == nullptr) {
        throw std::runtime_error(
            "curl::Easy copy assignment: curl_easy_duphandle failed");
    }
    // dup succeeded, now destroy any handle we might have and copy the tmp
    curl_easy_cleanup(handle);
    handle = tmp_handle;
    return *this;
}